

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall duckdb_fmt::v6::internal::bigint::assign(bigint *this,uint64_t n)

{
  uint *puVar1;
  size_t new_size;
  
  puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  new_size = 0;
  do {
    puVar1[new_size] = (uint)n;
    new_size = new_size + 1;
    n = n >> 0x20;
  } while (n != 0);
  buffer<unsigned_int>::resize((buffer<unsigned_int> *)this,new_size);
  this->exp_ = 0;
  return;
}

Assistant:

void assign(uint64_t n) {
    int num_bigits = 0;
    do {
      bigits_[num_bigits++] = n & ~bigit(0);
      n >>= bigit_bits;
    } while (n != 0);
    bigits_.resize(num_bigits);
    exp_ = 0;
  }